

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_commandline.hpp
# Opt level: O1

void Catch::setRngSeed(ConfigData *config,string *seed)

{
  int iVar1;
  time_t tVar2;
  runtime_error *this;
  long local_1a0;
  stringstream ss;
  ostream local_190 [16];
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  iVar1 = std::__cxx11::string::compare((char *)seed);
  if (iVar1 == 0) {
    tVar2 = time((time_t *)0x0);
    config->rngSeed = (uint)tVar2;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,(seed->_M_dataplus)._M_p,seed->_M_string_length);
    std::istream::_M_extract<unsigned_int>((uint *)&local_1a0);
    if ((abStack_180[*(long *)(local_1a0 + -0x18)] & 5) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Argment to --rng-seed should be the word \'time\' or a number");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

inline void setRngSeed( ConfigData& config, std::string const& seed ) {
        if( seed == "time" ) {
            config.rngSeed = static_cast<unsigned int>( std::time(0) );
        }
        else {
            std::stringstream ss;
            ss << seed;
            ss >> config.rngSeed;
            if( ss.fail() )
                throw std::runtime_error( "Argment to --rng-seed should be the word 'time' or a number" );
        }
    }